

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsitem.cpp
# Opt level: O3

void __thiscall
QGraphicsTextItem::QGraphicsTextItem(QGraphicsTextItem *this,QString *text,QGraphicsItem *parent)

{
  QGraphicsItemPrivate *this_00;
  QGraphicsTextItemPrivate *this_01;
  QWidgetTextControl *this_02;
  
  this_00 = (QGraphicsItemPrivate *)operator_new(0x178);
  QGraphicsItemPrivate::QGraphicsItemPrivate(this_00);
  QGraphicsObject::QGraphicsObject((QGraphicsObject *)this,this_00,parent);
  *(undefined ***)this = &PTR_metaObject_00812068;
  *(undefined ***)(this + 0x10) = &PTR__QGraphicsTextItem_008121c0;
  this_01 = (QGraphicsTextItemPrivate *)operator_new(0x38);
  this_01->control = (QWidgetTextControl *)0x0;
  (this_01->boundingRect).xp = 0.0;
  (this_01->boundingRect).yp = 0.0;
  (this_01->boundingRect).w = 0.0;
  *(undefined8 *)((long)&(this_01->boundingRect).w + 7) = 0;
  *(undefined8 *)((long)&(this_01->boundingRect).h + 7) = 0;
  *(QGraphicsTextItemPrivate **)(this + 0x20) = this_01;
  this_01->qq = (QGraphicsTextItem *)this;
  if ((text->d).size != 0) {
    this_02 = (QWidgetTextControl *)QGraphicsTextItemPrivate::textControl(this_01);
    QWidgetTextControl::setPlainText(this_02,text);
  }
  *(ulong *)(*(long *)(this + 0x18) + 0x160) = *(ulong *)(*(long *)(this + 0x18) + 0x160) | 0x800;
  QGraphicsItem::setAcceptHoverEvents((QGraphicsItem *)(this + 0x10),true);
  QGraphicsItem::setFlags((QGraphicsItem *)(this + 0x10),(GraphicsItemFlags)0x200);
  return;
}

Assistant:

QGraphicsTextItem::QGraphicsTextItem(const QString &text, QGraphicsItem *parent)
    : QGraphicsObject(*new QGraphicsItemPrivate, parent),
      dd(new QGraphicsTextItemPrivate)
{
    dd->qq = this;
    if (!text.isEmpty())
        setPlainText(text);
    setAcceptDrops(true);
    setAcceptHoverEvents(true);
    setFlags(ItemUsesExtendedStyleOption);
}